

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O2

void __thiscall flow::lang::Symbol::Symbol(Symbol *this,Type t,string *name,SourceLocation *loc)

{
  ASTNode::ASTNode(&this->super_ASTNode,loc);
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__Symbol_0019a668;
  this->type_ = t;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  this->owner_ = (SymbolTable *)0x0;
  return;
}

Assistant:

Symbol(Type t, const std::string& name, const SourceLocation& loc)
      : ASTNode(loc), type_(t), name_(name), owner_(nullptr) {}